

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

Cluster * __thiscall amrex::Cluster::new_chop(Cluster *this)

{
  Cut __pred;
  Long LVar1;
  int iVar2;
  int *piVar3;
  IntVect *pIVar4;
  Cluster *in_RDI;
  Real RVar5;
  Real RVar6;
  Real RVar7;
  IntVect IVar8;
  Real neweff;
  unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_> newbox;
  int orig_mlen;
  Real oldeff;
  IntVect *prt_it;
  int nhi;
  int i;
  int nlo;
  int mincutlen;
  int minlen;
  int n_2;
  int dir;
  int n_1;
  IntVect cut;
  CutStatus status [3];
  CutStatus mincut;
  int n_try;
  int invalid_dir;
  int *p;
  int n;
  Array<Vector<int>,_3> hist;
  IntVect len;
  int *hi;
  int *lo;
  pointer in_stack_fffffffffffffdf8;
  Cluster *in_stack_fffffffffffffe00;
  Box *in_stack_fffffffffffffe08;
  Cluster *in_stack_fffffffffffffe10;
  IntVect *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  CutStatus *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  IntVect *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe84;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  IntVect local_154;
  int aiStack_148 [6];
  IntVect *local_130;
  int local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_10c;
  Cluster *in_stack_ffffffffffffff38;
  undefined8 local_c0;
  int local_b8;
  undefined8 local_b0;
  int local_a8;
  int *local_a0;
  int *local_98;
  Cluster *local_88;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  IntVect *local_50;
  int local_44;
  IntVect *local_40;
  int local_34;
  IntVect *local_30;
  int local_24;
  IntVect *local_20;
  int local_14;
  IntVect *local_10;
  char *local_8;
  
  local_98 = Box::loVect(&in_RDI->m_bx);
  local_a0 = Box::hiVect(&in_RDI->m_bx);
  IVar8 = Box::size(in_stack_fffffffffffffe08);
  local_b8 = IVar8.vect[2];
  local_a8 = local_b8;
  local_c0 = IVar8.vect._0_8_;
  local_b0 = local_c0;
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::array
            ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe10);
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
            ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe00,
             (size_type)in_stack_fffffffffffffdf8);
  local_58 = &local_b0;
  local_5c = 0;
  local_10c = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (size_type)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20->vect);
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
            ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe00,
             (size_type)in_stack_fffffffffffffdf8);
  local_68 = &local_b0;
  local_6c = 1;
  local_120 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (size_type)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20->vect);
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
            ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe00,
             (size_type)in_stack_fffffffffffffdf8);
  local_78 = &local_b0;
  local_7c = 2;
  local_124 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (size_type)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20->vect);
  for (local_128 = 0; (long)local_128 < in_RDI->m_len; local_128 = local_128 + 1) {
    local_130 = in_RDI->m_ar + local_128;
    local_50 = local_130;
    std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
              ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe00,
               (size_type)in_stack_fffffffffffffdf8);
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                        (size_type)in_stack_fffffffffffffdf8);
    *piVar3 = *piVar3 + 1;
    std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
              ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe00,
               (size_type)in_stack_fffffffffffffdf8);
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                        (size_type)in_stack_fffffffffffffdf8);
    *piVar3 = *piVar3 + 1;
    std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
              ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe00,
               (size_type)in_stack_fffffffffffffdf8);
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                        (size_type)in_stack_fffffffffffffdf8);
    *piVar3 = *piVar3 + 1;
  }
  aiStack_148[5] = -1;
  aiStack_148[4] = 0;
  do {
    if (1 < aiStack_148[4]) {
      local_8 = "Should never reach this point in Cluster::new_chop()";
      Abort_host((char *)in_stack_fffffffffffffe10);
      local_88 = in_RDI;
LAB_016430b6:
      std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::~array
                ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe10);
      return local_88;
    }
    aiStack_148[3] = 3;
    IntVect::IntVect(&local_154);
    for (local_158 = 0; local_158 < 3; local_158 = local_158 + 1) {
      if (local_158 != aiStack_148[5]) {
        std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
                  ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe00
                   ,(size_type)in_stack_fffffffffffffdf8);
        std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x1642bd9)
        ;
        in_stack_fffffffffffffe34 =
             FindCut(in_stack_fffffffffffffe78->vect,in_stack_fffffffffffffe74,
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        local_10 = &local_154;
        local_14 = local_158;
        local_154.vect[local_158] = in_stack_fffffffffffffe34;
        if (aiStack_148[local_158] < aiStack_148[3]) {
          aiStack_148[3] = aiStack_148[local_158];
        }
      }
    }
    local_15c = -1;
    local_164 = -1;
    for (local_160 = 0; local_160 < 3; local_160 = local_160 + 1) {
      if (aiStack_148[local_160] == aiStack_148[3]) {
        local_30 = &local_154;
        local_24 = local_160;
        local_16c = local_30->vect[local_160] - local_98[local_160];
        local_34 = local_160;
        local_170 = local_a0[local_160] - local_30->vect[local_160];
        local_20 = local_30;
        in_stack_fffffffffffffe28 = std::min<int>(&local_16c,&local_170);
        local_168 = *in_stack_fffffffffffffe28;
        if (local_164 <= local_168) {
          local_15c = local_160;
          local_164 = local_168;
        }
      }
    }
    local_174 = 0;
    local_178 = local_98[local_15c];
    while( true ) {
      local_40 = &local_154;
      local_44 = local_15c;
      if (local_40->vect[local_15c] <= local_178) break;
      std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
                ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)in_stack_fffffffffffffe00,
                 (size_type)in_stack_fffffffffffffdf8);
      piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                          (size_type)in_stack_fffffffffffffdf8);
      local_174 = *piVar3 + local_174;
      local_178 = local_178 + 1;
    }
    if ((local_174 < 1) || (in_RDI->m_len <= (long)local_174)) {
      local_88 = chop(in_stack_ffffffffffffff38);
      goto LAB_016430b6;
    }
    iVar2 = (int)in_RDI->m_len - local_174;
    in_stack_fffffffffffffe10 = (Cluster *)in_RDI->m_ar;
    pIVar4 = &(in_stack_fffffffffffffe10->m_bx).smallend + in_RDI->m_len;
    anon_unknown_8::Cut::Cut((Cut *)&stack0xfffffffffffffe68,&local_154,local_15c);
    __pred.m_cut.vect[2] = in_stack_fffffffffffffe30;
    __pred.m_cut.vect._0_8_ = in_stack_fffffffffffffe28;
    __pred.m_dir = in_stack_fffffffffffffe34;
    pIVar4 = std::partition<amrex::IntVect*,amrex::(anonymous_namespace)::Cut>
                       (in_stack_fffffffffffffe20,pIVar4,__pred);
    in_stack_fffffffffffffe78 = pIVar4;
    RVar5 = eff(in_stack_fffffffffffffe00);
    LVar1 = in_RDI->m_len;
    in_stack_fffffffffffffe00 = (Cluster *)operator_new(0x30);
    Cluster(in_stack_fffffffffffffe10,pIVar4,(Long)in_stack_fffffffffffffe00);
    std::unique_ptr<amrex::Cluster,std::default_delete<amrex::Cluster>>::
    unique_ptr<std::default_delete<amrex::Cluster>,void>
              ((unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_> *)
               in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_>::operator->
              ((unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_> *)0x1642fb6);
    RVar6 = eff(in_stack_fffffffffffffe00);
    in_RDI->m_len = (long)local_174;
    minBox((Cluster *)CONCAT44(in_stack_fffffffffffffe84,iVar2));
    RVar7 = eff(in_stack_fffffffffffffe00);
    if (((RVar5 < RVar7) || (RVar5 < RVar6)) || (0 < aiStack_148[4])) {
      local_88 = std::unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_>::release
                           ((unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_> *)
                            0x164300e);
      iVar2 = 1;
    }
    else {
      in_RDI->m_len = (long)(int)LVar1;
      minBox((Cluster *)CONCAT44(in_stack_fffffffffffffe84,iVar2));
      aiStack_148[5] = local_15c;
      iVar2 = 0;
    }
    std::unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_>::~unique_ptr
              ((unique_ptr<amrex::Cluster,_std::default_delete<amrex::Cluster>_> *)
               in_stack_fffffffffffffe00);
    if (iVar2 != 0) goto LAB_016430b6;
    aiStack_148[4] = aiStack_148[4] + 1;
    in_stack_fffffffffffffe84 = 0;
  } while( true );
}

Assistant:

Cluster*
Cluster::new_chop ()
{
    BL_ASSERT(m_len > 1);
    BL_ASSERT(!(m_ar == 0));

    const int*    lo  = m_bx.loVect();
    const int*    hi  = m_bx.hiVect();
    const IntVect len = m_bx.size();
    //
    // Compute histogram.
    //
    Array<Vector<int>,AMREX_SPACEDIM> hist;
    AMREX_D_TERM(hist[0].resize(len[0], 0);,
                 hist[1].resize(len[1], 0);,
                 hist[2].resize(len[2], 0);)
    for (int n = 0; n < m_len; n++)
    {
        const int* p = m_ar[n].getVect();
        AMREX_D_TERM( hist[0][p[0]-lo[0]]++;,
                      hist[1][p[1]-lo[1]]++;,
                      hist[2][p[2]-lo[2]]++; )
    }

    int invalid_dir = -1;
    for (int n_try = 0; n_try < 2; n_try++)
    {
       //
       // Find cutpoint and cutstatus in each index direction.
       //
       CutStatus mincut = InvalidCut;
       CutStatus status[AMREX_SPACEDIM];
       IntVect cut;
       for (int n = 0; n < AMREX_SPACEDIM; n++)
       {
           if (n != invalid_dir)
           {
              cut[n] = FindCut(hist[n].data(), lo[n], hi[n], status[n]);
              if (status[n] < mincut)
              {
                  mincut = status[n];
              }
           }
       }
       BL_ASSERT(mincut != InvalidCut);
       //
       // Select best cutpoint and direction.
       //
       int dir = -1;
       for (int n = 0, minlen = -1; n < AMREX_SPACEDIM; n++)
       {
           if (status[n] == mincut)
           {
               int mincutlen = std::min(cut[n]-lo[n],hi[n]-cut[n]);
               if (mincutlen >= minlen)
               {
                   dir = n;
                   minlen = mincutlen;
               }
           }
       }
       BL_ASSERT(dir >= 0 && dir < AMREX_SPACEDIM);

       int nlo = 0;
       for (int i = lo[dir]; i < cut[dir]; i++) {
           nlo += hist[dir][i-lo[dir]];
       }

       if (nlo <= 0 || nlo >= m_len) return chop();

       int nhi = m_len - nlo;

       IntVect* prt_it = std::partition(m_ar, m_ar+m_len, Cut(cut,dir));

       BL_ASSERT((prt_it-m_ar) == nlo);
       BL_ASSERT(((m_ar+m_len)-prt_it) == nhi);

       // These refer to the box that was originally passed in
       Real oldeff = eff();
       int orig_mlen = m_len;

       // Define the new box "above" the cut
       std::unique_ptr<Cluster> newbox(new Cluster(prt_it, nhi));
       Real neweff = newbox->eff();

       // Replace the current box by the part of the box "below" the cut
       m_len = nlo;
       minBox();

       if ( (eff() > oldeff) || (neweff > oldeff) || n_try > 0)
       {
          return newbox.release();

       } else {

          // Restore the original box and try again, cutting in a different direction
          m_len = orig_mlen;
          minBox();
          invalid_dir = dir;
       }
   }

    amrex::Abort("Should never reach this point in Cluster::new_chop()");
    return this;
}